

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::NewFixedFunctionValue(GlobOpt *this,JavascriptFunction *function,AddrOpnd *addrOpnd)

{
  JitArenaAllocator *allocator;
  code *pcVar1;
  AddrOpnd *varValue;
  Value *pVVar2;
  bool bVar3;
  ValueType valueType;
  ValueNumber VVar4;
  ValueNumber VVar5;
  undefined4 *puVar6;
  ValueInfo *pVVar7;
  Sym *sym;
  Value *this_00;
  Var pvVar8;
  VarConstantValueInfo *pVVar9;
  GlobOptBlockData *pGVar10;
  VarConstantValueInfo *valueInfo;
  VarConstantValueInfo *symStoreVarConstantValueInfo;
  ValueInfo *symStoreValueInfo;
  Value *symStoreValue;
  Sym *symStore;
  Value *cachedValue;
  Value *val;
  AddrOpnd *addrOpnd_local;
  JavascriptFunction *function_local;
  GlobOpt *this_local;
  
  val = (Value *)addrOpnd;
  addrOpnd_local = (AddrOpnd *)function;
  function_local = (JavascriptFunction *)this;
  if (function == (JavascriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x11e8,"(function != nullptr)","function != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  cachedValue = (Value *)0x0;
  symStore = (Sym *)0x0;
  bVar3 = JsUtil::
          BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->addrConstantToValueMap,(void **)(val + 2),(Value **)&symStore);
  pVVar2 = cachedValue;
  if (bVar3) {
    pVVar7 = ::Value::GetValueInfo((Value *)symStore);
    sym = ValueInfo::GetSymStore(pVVar7);
    pVVar2 = cachedValue;
    if (sym != (Sym *)0x0) {
      pGVar10 = CurrentBlockData(this);
      bVar3 = GlobOptBlockData::IsLive(pGVar10,sym);
      pVVar2 = cachedValue;
      if (bVar3) {
        pGVar10 = CurrentBlockData(this);
        this_00 = GlobOptBlockData::FindValue(pGVar10,sym);
        pVVar2 = cachedValue;
        if (this_00 != (Value *)0x0) {
          VVar4 = ::Value::GetValueNumber(this_00);
          VVar5 = ::Value::GetValueNumber((Value *)symStore);
          pVVar2 = cachedValue;
          if (VVar4 == VVar5) {
            pVVar7 = ::Value::GetValueInfo(this_00);
            bVar3 = ValueInfo::IsVarConstant(pVVar7);
            pVVar2 = cachedValue;
            if (bVar3) {
              pVVar9 = ValueInfo::AsVarConstant(pVVar7);
              pvVar8 = VarConstantValueInfo::VarValue(pVVar9,false);
              pVVar2 = cachedValue;
              if ((pvVar8 == *(Var *)(val + 2)) &&
                 (bVar3 = VarConstantValueInfo::IsFunction(pVVar9), pVVar2 = this_00, !bVar3)) {
                pVVar2 = cachedValue;
              }
            }
          }
        }
      }
    }
  }
  cachedValue = pVVar2;
  varValue = addrOpnd_local;
  if (cachedValue == (Value *)0x0) {
    allocator = this->alloc;
    valueType = IR::Opnd::GetValueType((Opnd *)val);
    pVVar9 = VarConstantValueInfo::New(allocator,varValue,valueType,true,val[1].valueInfo);
    cachedValue = NewValue(this,&pVVar9->super_ValueInfo);
    JsUtil::
    BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew(this->addrConstantToValueMap,(void **)(val + 2),&cachedValue);
  }
  pGVar10 = CurrentBlockData(this);
  GlobOptBlockData::InsertNewValue(pGVar10,cachedValue,(Opnd *)val);
  return cachedValue;
}

Assistant:

Value *
GlobOpt::NewFixedFunctionValue(Js::JavascriptFunction *function, IR::AddrOpnd *addrOpnd)
{
    Assert(function != nullptr);

    Value *val = nullptr;
    Value *cachedValue = nullptr;
    if(this->addrConstantToValueMap->TryGetValue(addrOpnd->m_address, &cachedValue))
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *symStore = cachedValue->GetValueInfo()->GetSymStore();
        if(symStore && CurrentBlockData()->IsLive(symStore))
        {
            Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
            if(symStoreValue && symStoreValue->GetValueNumber() == cachedValue->GetValueNumber())
            {
                ValueInfo *const symStoreValueInfo = symStoreValue->GetValueInfo();
                if(symStoreValueInfo->IsVarConstant())
                {
                    VarConstantValueInfo *const symStoreVarConstantValueInfo = symStoreValueInfo->AsVarConstant();
                    if(symStoreVarConstantValueInfo->VarValue() == addrOpnd->m_address &&
                        symStoreVarConstantValueInfo->IsFunction())
                    {
                        val = symStoreValue;
                    }
                }
            }
        }
    }

    if(!val)
    {
        VarConstantValueInfo *valueInfo = VarConstantValueInfo::New(this->alloc, function, addrOpnd->GetValueType(), true, addrOpnd->m_localAddress);
        val = NewValue(valueInfo);
        this->addrConstantToValueMap->AddNew(addrOpnd->m_address, val);
    }

    CurrentBlockData()->InsertNewValue(val, addrOpnd);
    return val;
}